

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O2

bool __thiscall DIS::MinefieldStatePdu::operator==(MinefieldStatePdu *this,MinefieldStatePdu *rhs)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  pointer pVVar5;
  pointer pEVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  size_t idx;
  ulong uVar12;
  long lVar13;
  
  bVar7 = MinefieldFamilyPdu::operator==
                    (&this->super_MinefieldFamilyPdu,&rhs->super_MinefieldFamilyPdu);
  bVar8 = MinefieldIdentifier::operator==(&this->_minefieldID,&rhs->_minefieldID);
  uVar3 = this->_minefieldSequence;
  uVar4 = rhs->_minefieldSequence;
  uVar1 = rhs->_forceID;
  uVar2 = this->_forceID;
  bVar9 = EntityType::operator==(&this->_minefieldType,&rhs->_minefieldType);
  bVar10 = Vector3Double::operator==(&this->_minefieldLocation,&rhs->_minefieldLocation);
  bVar11 = EulerAngles::operator==(&this->_minefieldOrientation,&rhs->_minefieldOrientation);
  bVar7 = (uVar2 == uVar1 && (uVar3 == uVar4 && (bVar8 && bVar7))) &&
          (this->_protocolMode == rhs->_protocolMode &&
          (this->_appearance == rhs->_appearance && (bVar11 && (bVar10 && bVar9))));
  lVar13 = 0;
  for (uVar12 = 0;
      pVVar5 = (this->_perimeterPoints).
               super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this->_perimeterPoints).
                             super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4);
      uVar12 = uVar12 + 1) {
    bVar8 = Vector2Float::operator==
                      ((Vector2Float *)((long)&pVVar5->_vptr_Vector2Float + lVar13),
                       (Vector2Float *)
                       ((long)&((rhs->_perimeterPoints).
                                super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_Vector2Float +
                       lVar13));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar13 = lVar13 + 0x10;
  }
  lVar13 = 0;
  for (uVar12 = 0;
      pEVar6 = (this->_mineType).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this->_mineType).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar6 >> 4);
      uVar12 = uVar12 + 1) {
    bVar8 = EntityType::operator==
                      ((EntityType *)((long)&pEVar6->_vptr_EntityType + lVar13),
                       (EntityType *)
                       ((long)&((rhs->_mineType).
                                super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_EntityType +
                       lVar13));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar13 = lVar13 + 0x10;
  }
  return bVar7;
}

Assistant:

bool MinefieldStatePdu::operator ==(const MinefieldStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = MinefieldFamilyPdu::operator==(rhs);

     if( ! (_minefieldID == rhs._minefieldID) ) ivarsEqual = false;
     if( ! (_minefieldSequence == rhs._minefieldSequence) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_minefieldType == rhs._minefieldType) ) ivarsEqual = false;
     if( ! (_minefieldLocation == rhs._minefieldLocation) ) ivarsEqual = false;
     if( ! (_minefieldOrientation == rhs._minefieldOrientation) ) ivarsEqual = false;
     if( ! (_appearance == rhs._appearance) ) ivarsEqual = false;
     if( ! (_protocolMode == rhs._protocolMode) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _perimeterPoints.size(); idx++)
     {
        if( ! ( _perimeterPoints[idx] == rhs._perimeterPoints[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _mineType.size(); idx++)
     {
        if( ! ( _mineType[idx] == rhs._mineType[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }